

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_manager.cpp
# Opt level: O2

void __thiscall foxxll::block_manager::block_manager(block_manager *this)

{
  instance_pointer this_00;
  size_t new_size;
  disk_config *cfg;
  instance_pointer this_01;
  disk_block_allocator *this_02;
  long lVar1;
  ulong disk;
  string local_1c8;
  Logger local_1a8;
  
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  this->maximum_allocation_ = 0;
  (this->mutex_).super___mutex_base._M_mutex.__align = 0;
  this->total_allocation_ = 0;
  this->current_allocation_ = 0;
  (this->block_allocators_).size_ = 0;
  (this->block_allocators_).array_ = (value_type *)0x0;
  (this->disk_files_).size_ = 0;
  (this->disk_files_).array_ = (value_type *)0x0;
  this_00 = singleton<foxxll::config,_true>::get_instance();
  if (this_00->is_initialized == false) {
    (*this_00->_vptr_config[3])();
  }
  new_size = config::disks_number(this_00);
  this->ndisks_ = new_size;
  tlx::SimpleVector<foxxll::disk_block_allocator_*,_(tlx::SimpleVectorMode)0>::resize
            (&this->block_allocators_,new_size);
  tlx::
  SimpleVector<tlx::CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter>,_(tlx::SimpleVectorMode)0>
  ::resize(&this->disk_files_,this->ndisks_);
  lVar1 = 0;
  for (disk = 0; disk < this->ndisks_; disk = disk + 1) {
    cfg = config::disk(this_00,disk);
    if (cfg->queue == -1) {
      cfg->queue = (int)disk;
    }
    create_file((foxxll *)&local_1a8,cfg,0xc,(int)disk);
    tlx::CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter>::operator=
              ((CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter> *)
               ((long)&((this->disk_files_).array_)->ptr_ + lVar1),
               (CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter> *)&local_1a8);
    tlx::CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter>::dec_reference
              ((CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter> *)&local_1a8);
    tlx::Logger::Logger(&local_1a8);
    std::operator<<((ostream *)&local_1a8,"foxxll: Disk \'");
    std::operator<<((ostream *)&local_1a8,(string *)cfg);
    std::operator<<((ostream *)&local_1a8,"\' is allocated, space: ");
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    std::operator<<((ostream *)&local_1a8," MiB, I/O implementation: ");
    disk_config::fileio_string_abi_cxx11_(&local_1c8,cfg);
    std::operator<<((ostream *)&local_1a8,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    tlx::Logger::~Logger(&local_1a8);
    this_01 = singleton<foxxll::disk_queues,_true>::get_instance();
    disk_queues::make_queue(this_01,*(file **)((long)&((this->disk_files_).array_)->ptr_ + lVar1));
    this_02 = (disk_block_allocator *)operator_new(0x80);
    disk_block_allocator::disk_block_allocator
              (this_02,*(file **)((long)&((this->disk_files_).array_)->ptr_ + lVar1),cfg);
    *(disk_block_allocator **)((long)(this->block_allocators_).array_ + lVar1) = this_02;
    lVar1 = lVar1 + 8;
  }
  if (1 < this->ndisks_) {
    tlx::Logger::Logger(&local_1a8);
    std::operator<<((ostream *)&local_1a8,"foxxll: In total ");
    tlx::LoggerFormatter<unsigned_long,_void>::print((ostream *)&local_1a8,&this->ndisks_);
    std::operator<<((ostream *)&local_1a8," disks are allocated, space: ");
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    std::operator<<((ostream *)&local_1a8," MiB");
    tlx::Logger::~Logger(&local_1a8);
  }
  return;
}

Assistant:

block_manager::block_manager()
{
    config* config = config::get_instance();

    // initialize config (may read config files now)
    config->check_initialized();

    // allocate block_allocators_
    ndisks_ = config->disks_number();
    block_allocators_.resize(ndisks_);
    disk_files_.resize(ndisks_);

    uint64_t total_size = 0;

    for (size_t i = 0; i < ndisks_; ++i)
    {
        disk_config& cfg = config->disk(i);

        // assign queues in order of disks.
        if (cfg.queue == file::DEFAULT_QUEUE)
            cfg.queue = i;

        try
        {
            disk_files_[i] = create_file(cfg, file::CREAT | file::RDWR, i);

            TLX_LOG1 << "foxxll: Disk '" << cfg.path << "' is allocated, space: "
                     << (cfg.size) / (1024 * 1024)
                     << " MiB, I/O implementation: " << cfg.fileio_string();
        }
        catch (io_error&)
        {
            TLX_LOG1 << "foxxll: Error allocating disk '" << cfg.path << "', space: "
                     << (cfg.size) / (1024 * 1024)
                     << " MiB, I/O implementation: " << cfg.fileio_string();
            throw;
        }

        total_size += cfg.size;

        // create queue for the file.
        disk_queues::get_instance()->make_queue(disk_files_[i].get());

        block_allocators_[i] = new disk_block_allocator(disk_files_[i].get(), cfg);
    }

    if (ndisks_ > 1)
    {
        TLX_LOG1 << "foxxll: In total " << ndisks_ << " disks are allocated, space: "
                 << (total_size / (1024 * 1024)) << " MiB";
    }
}